

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureTestUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
          (RandomViewport *this,RenderTarget *renderTarget,int preferredWidth,int preferredHeight,
          deUint32 seed)

{
  deUint32 a;
  int iVar1;
  undefined1 local_34 [8];
  Random rnd;
  deUint32 seed_local;
  int preferredHeight_local;
  int preferredWidth_local;
  RenderTarget *renderTarget_local;
  RandomViewport *this_local;
  
  this->x = 0;
  this->y = 0;
  rnd.m_rnd.z = seed;
  rnd.m_rnd.w = preferredHeight;
  iVar1 = tcu::RenderTarget::getWidth(renderTarget);
  iVar1 = ::deMin32(preferredWidth,iVar1);
  a = rnd.m_rnd.w;
  this->width = iVar1;
  iVar1 = tcu::RenderTarget::getHeight(renderTarget);
  iVar1 = ::deMin32(a,iVar1);
  this->height = iVar1;
  de::Random::Random((Random *)local_34,rnd.m_rnd.z);
  iVar1 = tcu::RenderTarget::getWidth(renderTarget);
  iVar1 = de::Random::getInt((Random *)local_34,0,iVar1 - this->width);
  this->x = iVar1;
  iVar1 = tcu::RenderTarget::getHeight(renderTarget);
  iVar1 = de::Random::getInt((Random *)local_34,0,iVar1 - this->height);
  this->y = iVar1;
  de::Random::~Random((Random *)local_34);
  return;
}

Assistant:

RandomViewport::RandomViewport (const tcu::RenderTarget& renderTarget, int preferredWidth, int preferredHeight, deUint32 seed)
	: x			(0)
	, y			(0)
	, width		(deMin32(preferredWidth, renderTarget.getWidth()))
	, height	(deMin32(preferredHeight, renderTarget.getHeight()))
{
	de::Random rnd(seed);
	x = rnd.getInt(0, renderTarget.getWidth()	- width);
	y = rnd.getInt(0, renderTarget.getHeight()	- height);
}